

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

void __thiscall hmac_hash::SHA1::transform(SHA1 *this,uint32_t *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  
  uVar14 = this->m_h[0];
  uVar5 = this->m_h[1];
  uVar17 = this->m_h[2];
  uVar1 = this->m_h[3];
  uVar3 = ((uVar1 ^ uVar17) & uVar5 ^ uVar1) + *block + 0x5a827999 +
          (uVar14 << 5 | uVar14 >> 0x1b) + this->m_h[4];
  uVar9 = uVar5 << 0x1e | uVar5 >> 2;
  uVar1 = uVar1 + block[1] + ((uVar9 ^ uVar17) & uVar14 ^ uVar17) + 0x5a827999 +
          (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar20 = uVar14 << 0x1e | uVar14 >> 2;
  uVar14 = block[2];
  uVar4 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar3 = uVar17 + uVar14 + ((uVar9 ^ uVar20) & uVar3 ^ uVar9) + 0x5a827999 +
          (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar5 = block[3];
  uVar10 = uVar9 + uVar5 + ((uVar4 ^ uVar20) & uVar1 ^ uVar20) + 0x5a827999 +
           (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar9 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar17 = block[4];
  uVar6 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar20 = uVar20 + uVar17 + ((uVar9 ^ uVar4) & uVar3 ^ uVar4) + 0x5a827999 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar1 = block[5];
  uVar4 = uVar4 + uVar1 + ((uVar6 ^ uVar9) & uVar10 ^ uVar9) + 0x5a827999 +
          (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar11 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar3 = block[6];
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar10 = uVar9 + uVar3 + ((uVar11 ^ uVar6) & uVar20 ^ uVar6) + 0x5a827999 +
           (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar9 = block[7];
  uVar6 = uVar6 + uVar9 + ((uVar21 ^ uVar11) & uVar4 ^ uVar11) + 0x5a827999 +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar20 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar4 = block[8];
  uVar2 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar11 = uVar11 + uVar4 + ((uVar20 ^ uVar21) & uVar10 ^ uVar21) + 0x5a827999 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar10 = block[9];
  uVar22 = uVar21 + uVar10 + ((uVar2 ^ uVar20) & uVar6 ^ uVar20) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = block[10];
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar11 = uVar20 + uVar6 + ((uVar7 ^ uVar2) & uVar11 ^ uVar2) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar20 = block[0xb];
  uVar21 = uVar2 + uVar20 + ((uVar12 ^ uVar7) & uVar22 ^ uVar7) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar23 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar2 = block[0xc];
  uVar22 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar7 + uVar2 + ((uVar23 ^ uVar12) & uVar11 ^ uVar12) + 0x5a827999 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar11 = block[0xd];
  uVar13 = uVar12 + uVar11 + ((uVar22 ^ uVar23) & uVar21 ^ uVar23) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar12 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar21 = block[0xe];
  uVar8 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar24 = uVar23 + uVar21 + ((uVar12 ^ uVar22) & uVar7 ^ uVar22) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar7 = block[0xf];
  uVar22 = uVar22 + uVar7 + ((uVar8 ^ uVar12) & uVar13 ^ uVar12) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar15 = uVar4 ^ uVar11 ^ *block ^ uVar14;
  uVar23 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar16 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar12 = uVar12 + uVar16 + ((uVar23 ^ uVar8) & uVar24 ^ uVar8) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar13 = uVar10 ^ uVar21 ^ block[1] ^ uVar5;
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar19 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar13 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar8 = uVar8 + uVar19 + ((uVar24 ^ uVar23) & uVar22 ^ uVar23) + 0x5a827999 +
          (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar14 = uVar6 ^ uVar7 ^ uVar14 ^ uVar17;
  uVar15 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar23 = uVar23 + uVar15 + ((uVar13 ^ uVar24) & uVar12 ^ uVar24) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar14 = uVar5 ^ uVar1 ^ uVar20 ^ uVar16;
  uVar22 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar24 = uVar24 + uVar22 + ((uVar12 ^ uVar13) & uVar8 ^ uVar13) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar14 = uVar17 ^ uVar3 ^ uVar2 ^ uVar19;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar5 = uVar13 + uVar14 + (uVar8 ^ uVar12 ^ uVar23) + 0x6ed9eba1 +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar17 = uVar1 ^ uVar9 ^ uVar11 ^ uVar15;
  uVar18 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar17 = uVar12 + uVar18 + (uVar23 ^ uVar8 ^ uVar24) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar1 = uVar3 ^ uVar4 ^ uVar21 ^ uVar22;
  uVar24 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar13 = uVar8 + uVar24 + (uVar25 ^ uVar23 ^ uVar5) + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar3 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar9 ^ uVar10 ^ uVar7 ^ uVar14;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar9 = uVar23 + uVar5 + (uVar3 ^ uVar25 ^ uVar17) + 0x6ed9eba1 + (uVar13 * 0x20 | uVar13 >> 0x1b)
  ;
  uVar1 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar4 ^ uVar6 ^ uVar16 ^ uVar18;
  uVar12 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar8 = uVar25 + uVar12 + (uVar1 ^ uVar3 ^ uVar13) + 0x6ed9eba1 + (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar4 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar17 = uVar10 ^ uVar20 ^ uVar19 ^ uVar24;
  uVar25 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar13 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar3 + uVar25 + (uVar4 ^ uVar1 ^ uVar9) + 0x6ed9eba1 + (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar17 = uVar6 ^ uVar2 ^ uVar15 ^ uVar5;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar1 = uVar1 + uVar17 + (uVar13 ^ uVar4 ^ uVar8) + 0x6ed9eba1 + (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar3 = uVar20 ^ uVar11 ^ uVar22 ^ uVar12;
  uVar20 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar10 = uVar4 + uVar20 + (uVar8 ^ uVar13 ^ uVar9) + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar3 = uVar2 ^ uVar21 ^ uVar14 ^ uVar25;
  uVar4 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar2 = uVar13 + uVar4 + (uVar9 ^ uVar8 ^ uVar1) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar3 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = uVar11 ^ uVar7 ^ uVar18 ^ uVar17;
  uVar13 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar6 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar8 = uVar8 + uVar13 + (uVar3 ^ uVar9 ^ uVar10) + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b);
  uVar1 = uVar21 ^ uVar16 ^ uVar24 ^ uVar20;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar10 = uVar9 + uVar1 + (uVar6 ^ uVar3 ^ uVar2) + 0x6ed9eba1 + (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = uVar7 ^ uVar19 ^ uVar5 ^ uVar4;
  uVar11 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar3 = uVar3 + uVar11 + (uVar2 ^ uVar6 ^ uVar8) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar21 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar9 = uVar16 ^ uVar15 ^ uVar12 ^ uVar13;
  uVar23 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar6 = uVar6 + uVar23 + (uVar21 ^ uVar2 ^ uVar10) + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar9 = uVar19 ^ uVar22 ^ uVar25 ^ uVar1;
  uVar19 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = uVar2 + uVar19 + (uVar10 ^ uVar21 ^ uVar3) + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar3 = uVar15 ^ uVar14 ^ uVar17 ^ uVar11;
  uVar16 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar8 = uVar21 + uVar16 + (uVar9 ^ uVar10 ^ uVar6) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar2 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar3 = uVar22 ^ uVar18 ^ uVar20 ^ uVar23;
  uVar21 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar10 = uVar10 + uVar21 + (uVar2 ^ uVar9 ^ uVar7) + 0x6ed9eba1 + (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar14 = uVar14 ^ uVar24 ^ uVar4 ^ uVar19;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar3 = uVar9 + uVar14 + (uVar7 ^ uVar2 ^ uVar8) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar15 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar9 = uVar18 ^ uVar5 ^ uVar13 ^ uVar16;
  uVar8 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar6 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar9 = uVar2 + uVar8 + (uVar15 ^ uVar7 ^ uVar10) + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar10 = uVar24 ^ uVar12 ^ uVar1 ^ uVar21;
  uVar24 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar22 = uVar7 + uVar24 + (uVar6 ^ uVar15 ^ uVar3) + 0x6ed9eba1 + (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar5 = uVar5 ^ uVar25 ^ uVar11 ^ uVar14;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar15 = uVar15 + uVar5 + (uVar3 ^ uVar6 ^ uVar9) + 0x6ed9eba1 + (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar7 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar12 ^ uVar17 ^ uVar23 ^ uVar8;
  uVar10 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar2 = uVar6 + uVar10 + (uVar22 & uVar7 | (uVar22 | uVar7) & uVar3) + -0x70e44324 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar9 = uVar25 ^ uVar20 ^ uVar19 ^ uVar24;
  uVar6 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar3 = uVar3 + uVar6 + (uVar15 & uVar22 | (uVar15 | uVar22) & uVar7) + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar17 = uVar17 ^ uVar4 ^ uVar16 ^ uVar5;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar12 = uVar7 + uVar17 + (uVar2 & uVar15 | (uVar2 | uVar15) & uVar22) + -0x70e44324 +
           (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar7 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = uVar20 ^ uVar13 ^ uVar21 ^ uVar10;
  uVar2 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar22 = uVar22 + uVar2 + (uVar3 & uVar7 | (uVar3 | uVar7) & uVar15) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar9 = uVar4 ^ uVar1 ^ uVar14 ^ uVar6;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar15 = uVar15 + uVar9 + (uVar12 & uVar3 | (uVar12 | uVar3) & uVar7) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar4 = uVar13 ^ uVar11 ^ uVar8 ^ uVar17;
  uVar20 = uVar4 << 1 | (uint)((int)uVar4 < 0);
  uVar4 = uVar7 + uVar20 + (uVar22 & uVar12 | (uVar22 | uVar12) & uVar3) + -0x70e44324 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar1 = uVar1 ^ uVar23 ^ uVar24 ^ uVar2;
  uVar7 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar1 = uVar3 + uVar7 + (uVar15 & uVar22 | (uVar15 | uVar22) & uVar12) + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar18 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar3 = uVar11 ^ uVar19 ^ uVar5 ^ uVar9;
  uVar13 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar11 = uVar12 + uVar13 + (uVar4 & uVar18 | (uVar4 | uVar18) & uVar22) + -0x70e44324 +
           (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar3 = uVar23 ^ uVar16 ^ uVar10 ^ uVar20;
  uVar15 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar22 = uVar22 + uVar15 + (uVar1 & uVar4 | (uVar1 | uVar4) & uVar18) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar3 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = uVar19 ^ uVar21 ^ uVar6 ^ uVar7;
  uVar25 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar23 = uVar18 + uVar25 + (uVar11 & uVar3 | (uVar11 | uVar3) & uVar4) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar1 = uVar16 ^ uVar14 ^ uVar17 ^ uVar13;
  uVar16 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar4 = uVar4 + uVar16 + (uVar22 & uVar12 | (uVar22 | uVar12) & uVar3) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar1 = uVar21 ^ uVar8 ^ uVar2 ^ uVar15;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar3 = uVar3 + uVar1 + (uVar23 & uVar22 | (uVar23 | uVar22) & uVar12) + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar14 = uVar14 ^ uVar24 ^ uVar9 ^ uVar25;
  uVar11 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar12 = uVar12 + uVar11 + (uVar4 & uVar23 | (uVar4 | uVar23) & uVar22) + -0x70e44324 +
           (uVar3 * 0x20 | uVar3 >> 0x1b);
  uVar21 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar14 = uVar8 ^ uVar5 ^ uVar20 ^ uVar16;
  uVar4 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar22 = uVar22 + uVar4 + (uVar3 & uVar21 | (uVar3 | uVar21) & uVar23) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar14 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar3 = uVar24 ^ uVar10 ^ uVar7 ^ uVar1;
  uVar8 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar23 = uVar23 + uVar8 + (uVar12 & uVar14 | (uVar12 | uVar14) & uVar21) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar5 = uVar5 ^ uVar6 ^ uVar13 ^ uVar11;
  uVar3 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar21 = uVar21 + uVar3 + (uVar22 & uVar12 | (uVar22 | uVar12) & uVar14) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar5 = uVar10 ^ uVar17 ^ uVar15 ^ uVar4;
  uVar10 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar14 + uVar10 + (uVar23 & uVar22 | (uVar23 | uVar22) & uVar12) + -0x70e44324 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar14 = uVar6 ^ uVar2 ^ uVar25 ^ uVar8;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar12 = uVar12 + uVar14 + (uVar21 & uVar23 | (uVar21 | uVar23) & uVar22) + -0x70e44324 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar17 = uVar17 ^ uVar9 ^ uVar16 ^ uVar3;
  uVar18 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar22 = uVar22 + uVar18 + (uVar5 & uVar21 | (uVar5 | uVar21) & uVar23) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar17 = uVar2 ^ uVar20 ^ uVar1 ^ uVar10;
  uVar6 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar24 = uVar23 + uVar6 + (uVar12 & uVar5 | (uVar12 | uVar5) & uVar21) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar17 = uVar9 ^ uVar7 ^ uVar11 ^ uVar14;
  uVar2 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar9 = uVar21 + uVar2 + (uVar12 ^ uVar5 ^ uVar22) + -0x359d3e2a +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar17 = uVar20 ^ uVar13 ^ uVar4 ^ uVar18;
  uVar23 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar5 = uVar5 + uVar23 + (uVar22 ^ uVar12 ^ uVar24) + -0x359d3e2a + (uVar9 * 0x20 | uVar9 >> 0x1b)
  ;
  uVar19 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar17 = uVar7 ^ uVar15 ^ uVar8 ^ uVar6;
  uVar21 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar7 = uVar12 + uVar21 + (uVar19 ^ uVar22 ^ uVar9) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar20 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar17 = uVar13 ^ uVar25 ^ uVar3 ^ uVar2;
  uVar9 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar22 + uVar9 + (uVar20 ^ uVar19 ^ uVar5) + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar12 = uVar15 ^ uVar16 ^ uVar10 ^ uVar23;
  uVar24 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar19 + uVar24 + (uVar17 ^ uVar20 ^ uVar7) + -0x359d3e2a +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar22 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar25 ^ uVar1 ^ uVar14 ^ uVar21;
  uVar25 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar20 + uVar25 + (uVar22 ^ uVar17 ^ uVar5) + -0x359d3e2a +
          (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar16 ^ uVar11 ^ uVar18 ^ uVar9;
  uVar20 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar17 + uVar20 + (uVar13 ^ uVar22 ^ uVar12) + -0x359d3e2a +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar19 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar17 = uVar1 ^ uVar4 ^ uVar6 ^ uVar24;
  uVar15 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar12 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar1 = uVar22 + uVar15 + (uVar19 ^ uVar13 ^ uVar7) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar17 = uVar11 ^ uVar8 ^ uVar2 ^ uVar25;
  uVar16 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar11 = uVar13 + uVar16 + (uVar12 ^ uVar19 ^ uVar5) + -0x359d3e2a +
           (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar17 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar4 ^ uVar3 ^ uVar23 ^ uVar20;
  uVar5 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar19 = uVar19 + uVar5 + (uVar17 ^ uVar12 ^ uVar1) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar22 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = uVar8 ^ uVar10 ^ uVar21 ^ uVar15;
  uVar4 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar7 = uVar12 + uVar4 + (uVar22 ^ uVar17 ^ uVar11) + -0x359d3e2a +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar13 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar1 = uVar3 ^ uVar14 ^ uVar9 ^ uVar16;
  uVar11 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar8 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar1 = uVar17 + uVar11 + (uVar13 ^ uVar22 ^ uVar19) + -0x359d3e2a +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar17 = uVar10 ^ uVar18 ^ uVar24 ^ uVar5;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar12 = uVar22 + uVar17 + (uVar8 ^ uVar13 ^ uVar7) + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b)
  ;
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar14 = uVar14 ^ uVar6 ^ uVar25 ^ uVar4;
  uVar3 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar7 = uVar13 + uVar3 + (uVar10 ^ uVar8 ^ uVar1) + -0x359d3e2a + (uVar12 * 0x20 | uVar12 >> 0x1b)
  ;
  *block = uVar24;
  block[1] = uVar25;
  block[2] = uVar20;
  uVar14 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = uVar18 ^ uVar2 ^ uVar20 ^ uVar11;
  uVar1 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  uVar22 = uVar8 + uVar1 + (uVar14 ^ uVar10 ^ uVar12) + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  block[3] = uVar15;
  block[4] = uVar16;
  block[5] = uVar5;
  block[6] = uVar4;
  block[7] = uVar11;
  block[8] = uVar17;
  uVar17 = uVar6 ^ uVar23 ^ uVar15 ^ uVar17;
  uVar6 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar10 = uVar10 + uVar17 + (uVar6 ^ uVar14 ^ uVar7) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  block[9] = uVar3;
  uVar3 = uVar2 ^ uVar21 ^ uVar16 ^ uVar3;
  uVar20 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar3 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  uVar14 = uVar14 + uVar3 + (uVar20 ^ uVar6 ^ uVar22) + -0x359d3e2a +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  block[10] = uVar1;
  uVar1 = uVar23 ^ uVar9 ^ uVar5 ^ uVar1;
  block[0xb] = uVar17;
  block[0xc] = uVar3;
  uVar5 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  block[0xd] = uVar5;
  uVar2 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar5 = uVar5 + uVar6 + (uVar2 ^ uVar20 ^ uVar10) + -0x359d3e2a + (uVar14 * 0x20 | uVar14 >> 0x1b)
  ;
  uVar17 = uVar24 ^ uVar21 ^ uVar4 ^ uVar17;
  uVar1 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  block[0xe] = uVar17;
  uVar3 = uVar25 ^ uVar9 ^ uVar11 ^ uVar3;
  uVar3 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  block[0xf] = uVar3;
  uVar17 = uVar17 + uVar20 + (uVar1 ^ uVar2 ^ uVar14) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  this->m_h[0] = uVar3 + this->m_h[0] + uVar2 + (uVar14 ^ uVar1 ^ uVar5) + -0x359d3e2a +
                 (uVar17 * 0x20 | uVar17 >> 0x1b);
  this->m_h[1] = uVar17 + this->m_h[1];
  this->m_h[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + this->m_h[2];
  this->m_h[3] = uVar14 + this->m_h[3];
  this->m_h[4] = uVar1 + this->m_h[4];
  this->m_transforms = this->m_transforms + 1;
  return;
}

Assistant:

void SHA1::transform(uint32_t *block) {
        uint32_t a = m_h[0];
        uint32_t b = m_h[1];
        uint32_t c = m_h[2];
        uint32_t d = m_h[3];
        uint32_t e = m_h[4];

        // 4 rounds of 20 operations each. Loop unrolled
        SHA1_R0(a,b,c,d,e, 0);
        SHA1_R0(e,a,b,c,d, 1);
        SHA1_R0(d,e,a,b,c, 2);
        SHA1_R0(c,d,e,a,b, 3);
        SHA1_R0(b,c,d,e,a, 4);
        SHA1_R0(a,b,c,d,e, 5);
        SHA1_R0(e,a,b,c,d, 6);
        SHA1_R0(d,e,a,b,c, 7);
        SHA1_R0(c,d,e,a,b, 8);
        SHA1_R0(b,c,d,e,a, 9);
        SHA1_R0(a,b,c,d,e,10);
        SHA1_R0(e,a,b,c,d,11);
        SHA1_R0(d,e,a,b,c,12);
        SHA1_R0(c,d,e,a,b,13);
        SHA1_R0(b,c,d,e,a,14);
        SHA1_R0(a,b,c,d,e,15);
        SHA1_R1(e,a,b,c,d,16);
        SHA1_R1(d,e,a,b,c,17);
        SHA1_R1(c,d,e,a,b,18);
        SHA1_R1(b,c,d,e,a,19);
        SHA1_R2(a,b,c,d,e,20);
        SHA1_R2(e,a,b,c,d,21);
        SHA1_R2(d,e,a,b,c,22);
        SHA1_R2(c,d,e,a,b,23);
        SHA1_R2(b,c,d,e,a,24);
        SHA1_R2(a,b,c,d,e,25);
        SHA1_R2(e,a,b,c,d,26);
        SHA1_R2(d,e,a,b,c,27);
        SHA1_R2(c,d,e,a,b,28);
        SHA1_R2(b,c,d,e,a,29);
        SHA1_R2(a,b,c,d,e,30);
        SHA1_R2(e,a,b,c,d,31);
        SHA1_R2(d,e,a,b,c,32);
        SHA1_R2(c,d,e,a,b,33);
        SHA1_R2(b,c,d,e,a,34);
        SHA1_R2(a,b,c,d,e,35);
        SHA1_R2(e,a,b,c,d,36);
        SHA1_R2(d,e,a,b,c,37);
        SHA1_R2(c,d,e,a,b,38);
        SHA1_R2(b,c,d,e,a,39);
        SHA1_R3(a,b,c,d,e,40);
        SHA1_R3(e,a,b,c,d,41);
        SHA1_R3(d,e,a,b,c,42);
        SHA1_R3(c,d,e,a,b,43);
        SHA1_R3(b,c,d,e,a,44);
        SHA1_R3(a,b,c,d,e,45);
        SHA1_R3(e,a,b,c,d,46);
        SHA1_R3(d,e,a,b,c,47);
        SHA1_R3(c,d,e,a,b,48);
        SHA1_R3(b,c,d,e,a,49);
        SHA1_R3(a,b,c,d,e,50);
        SHA1_R3(e,a,b,c,d,51);
        SHA1_R3(d,e,a,b,c,52);
        SHA1_R3(c,d,e,a,b,53);
        SHA1_R3(b,c,d,e,a,54);
        SHA1_R3(a,b,c,d,e,55);
        SHA1_R3(e,a,b,c,d,56);
        SHA1_R3(d,e,a,b,c,57);
        SHA1_R3(c,d,e,a,b,58);
        SHA1_R3(b,c,d,e,a,59);
        SHA1_R4(a,b,c,d,e,60);
        SHA1_R4(e,a,b,c,d,61);
        SHA1_R4(d,e,a,b,c,62);
        SHA1_R4(c,d,e,a,b,63);
        SHA1_R4(b,c,d,e,a,64);
        SHA1_R4(a,b,c,d,e,65);
        SHA1_R4(e,a,b,c,d,66);
        SHA1_R4(d,e,a,b,c,67);
        SHA1_R4(c,d,e,a,b,68);
        SHA1_R4(b,c,d,e,a,69);
        SHA1_R4(a,b,c,d,e,70);
        SHA1_R4(e,a,b,c,d,71);
        SHA1_R4(d,e,a,b,c,72);
        SHA1_R4(c,d,e,a,b,73);
        SHA1_R4(b,c,d,e,a,74);
        SHA1_R4(a,b,c,d,e,75);
        SHA1_R4(e,a,b,c,d,76);
        SHA1_R4(d,e,a,b,c,77);
        SHA1_R4(c,d,e,a,b,78);
        SHA1_R4(b,c,d,e,a,79);
     
        // Add the working vars back into m_h
        m_h[0] += a;
        m_h[1] += b;
        m_h[2] += c;
        m_h[3] += d;
        m_h[4] += e;
     
        // Count the number of transformations
        m_transforms++;
    }